

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

void slang::ast::RandSeqProductionSymbol::createRuleVariables
               (RsRuleSyntax *syntax,Scope *scope,
               SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  uint uVar1;
  Compilation *this;
  RandSeqProductionSymbol *pRVar2;
  ushort uVar3;
  DeferredSourceRange sourceRange;
  VariableSymbol *pVVar4;
  Type *pTVar5;
  char_pointer puVar6;
  char_pointer puVar7;
  table_element_pointer ppVar8;
  DeclaredType *this_00;
  RsIfElseSyntax *ries;
  char_pointer puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  iterator iVar12;
  anon_class_16_2_7e13625a countProd;
  SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  prodMap;
  VariableLifetime local_154;
  Scope *local_150;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_148;
  Token local_140;
  SourceLocation local_130;
  Scope *local_128;
  Storage *local_120;
  undefined1 local_118 [16];
  RsRuleSyntax *local_108;
  undefined1 local_f8 [128];
  Storage *local_78;
  undefined1 local_70 [40];
  size_ctrl_type local_48;
  
  local_120 = (Storage *)local_f8;
  local_70._8_8_ = 0x3f;
  local_70._16_8_ = 1;
  local_70._24_16_ = ZEXT816(0x474ad0);
  local_48.ml = 0;
  local_48.size = 0;
  local_150 = scope;
  local_148 = results;
  local_128 = scope;
  local_78 = local_120;
  local_70._0_8_ = local_120;
  if ((syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>._M_extent.
      _M_extent_value != 0) {
    (*(code *)(&DAT_00479ca4 +
              *(int *)(&DAT_00479ca4 +
                      (ulong)(((*(syntax->prods).
                                 super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.
                                 _M_ptr)->super_SyntaxNode).kind - RsCase) * 4)))();
    return;
  }
  this = scope->compilation;
  iVar12 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
                    *)local_70);
  if (iVar12.p_ != (table_element_pointer)0x0) {
LAB_001ff100:
    do {
      pRVar2 = (iVar12.p_)->first;
      uVar1 = (iVar12.p_)->second;
      local_140 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
      local_130 = parsing::Token::location(&local_140);
      local_154 = Automatic;
      pVVar4 = BumpAllocator::
               emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation,slang::ast::VariableLifetime>
                         (&this->super_BumpAllocator,&(pRVar2->super_Symbol).name,&local_130,
                          &local_154);
      *(byte *)&(pVVar4->flags).m_bits = (byte)(pVVar4->flags).m_bits | 3;
      this_00 = &pRVar2->declaredReturnType;
      if (uVar1 == 1) {
        pTVar5 = DeclaredType::getType(this_00);
      }
      else {
        pTVar5 = DeclaredType::getType(this_00);
        local_118 = (undefined1  [16])0x0;
        sourceRange.node.value = (uintptr_t)syntax;
        sourceRange.range = (SourceRange)ZEXT816(0);
        local_108 = syntax;
        pTVar5 = FixedSizeUnpackedArrayType::fromDim
                           (local_150,pTVar5,(ConstantRange)(((ulong)uVar1 << 0x20) + 1),sourceRange
                           );
      }
      (pVVar4->super_ValueSymbol).declaredType.type = pTVar5;
      local_140._0_8_ = pVVar4;
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)local_148,(Symbol **)&local_140);
      puVar7 = iVar12.pc_ + 0x12;
      puVar9 = iVar12.pc_ + 2;
      while( true ) {
        puVar6 = puVar9;
        puVar9 = iVar12.pc_;
        ppVar8 = iVar12.p_ + 1;
        if (((uint)iVar12.pc_ & 0xf) == 0xe) break;
        iVar12.p_ = ppVar8;
        iVar12.pc_ = puVar9 + 1;
        puVar7 = puVar7 + 1;
        puVar9 = puVar6 + 1;
        if (puVar6[-1] != '\0') goto code_r0x001ff1fb;
      }
      auVar10[0] = -(*puVar6 == '\0');
      auVar10[1] = -(puVar6[1] == '\0');
      auVar10[2] = -(puVar6[2] == '\0');
      auVar10[3] = -(puVar6[3] == '\0');
      auVar10[4] = -(puVar6[4] == '\0');
      auVar10[5] = -(puVar6[5] == '\0');
      auVar10[6] = -(puVar6[6] == '\0');
      auVar10[7] = -(puVar6[7] == '\0');
      auVar10[8] = -(puVar6[8] == '\0');
      auVar10[9] = -(puVar6[9] == '\0');
      auVar10[10] = -(puVar6[10] == '\0');
      auVar10[0xb] = -(puVar6[0xb] == '\0');
      auVar10[0xc] = -(puVar6[0xc] == '\0');
      auVar10[0xd] = -(puVar6[0xd] == '\0');
      auVar10[0xe] = -(puVar6[0xe] == '\0');
      auVar10[0xf] = -(puVar6[0xf] == '\0');
      uVar3 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe;
      while (uVar3 == 0x7fff) {
        ppVar8 = ppVar8 + 0xf;
        auVar11[0] = -(*puVar7 == '\0');
        auVar11[1] = -(puVar7[1] == '\0');
        auVar11[2] = -(puVar7[2] == '\0');
        auVar11[3] = -(puVar7[3] == '\0');
        auVar11[4] = -(puVar7[4] == '\0');
        auVar11[5] = -(puVar7[5] == '\0');
        auVar11[6] = -(puVar7[6] == '\0');
        auVar11[7] = -(puVar7[7] == '\0');
        auVar11[8] = -(puVar7[8] == '\0');
        auVar11[9] = -(puVar7[9] == '\0');
        auVar11[10] = -(puVar7[10] == '\0');
        auVar11[0xb] = -(puVar7[0xb] == '\0');
        auVar11[0xc] = -(puVar7[0xc] == '\0');
        auVar11[0xd] = -(puVar7[0xd] == '\0');
        auVar11[0xe] = -(puVar7[0xe] == '\0');
        auVar11[0xf] = -(puVar7[0xf] == '\0');
        puVar6 = puVar7;
        puVar7 = puVar7 + 0x10;
        uVar3 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe;
      }
      uVar1 = 0;
      if ((uVar3 ^ 0x7fff) != 0) {
        for (; ((uVar3 ^ 0x7fff) >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      if (puVar6[uVar1] == '\x01') break;
      iVar12.p_ = (table_element_pointer)((long)&ppVar8->first + (ulong)(uVar1 << 4));
      iVar12.pc_ = puVar6 + uVar1;
    } while( true );
  }
LAB_001ff26a:
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  ::delete_((allocator_type)local_70._0_8_,
            (table_arrays<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
             *)(local_70 + 8));
  return;
code_r0x001ff1fb:
  if (puVar6[-1] != '\x01') {
    iVar12.pc_ = puVar6 + -1;
    goto LAB_001ff100;
  }
  goto LAB_001ff26a;
}

Assistant:

void RandSeqProductionSymbol::createRuleVariables(const RsRuleSyntax& syntax, const Scope& scope,
                                                  SmallVectorBase<const Symbol*>& results) {
    SmallMap<const RandSeqProductionSymbol*, uint32_t, 8> prodMap;
    auto countProd = [&](const RsProdItemSyntax& item) {
        auto symbol = Lookup::unqualified(scope, item.name.valueText(),
                                          LookupFlags::AllowDeclaredAfter);
        if (symbol && symbol->kind == SymbolKind::RandSeqProduction) {
            auto& prod = symbol->as<RandSeqProductionSymbol>();
            auto& type = prod.getReturnType();
            if (!type.isVoid()) {
                auto [it, inserted] = prodMap.emplace(&prod, 1);
                if (!inserted)
                    it->second++;
            }
        }
    };

    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                countProd(p->as<RsProdItemSyntax>());
                break;
            case SyntaxKind::RsCodeBlock:
                break;
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                countProd(*ries.ifItem);
                if (ries.elseClause)
                    countProd(*ries.elseClause->item);
                break;
            }
            case SyntaxKind::RsRepeat:
                countProd(*p->as<RsRepeatSyntax>().item);
                break;
            case SyntaxKind::RsCase:
                for (auto item : p->as<RsCaseSyntax>().items) {
                    switch (item->kind) {
                        case SyntaxKind::StandardRsCaseItem:
                            countProd(*item->as<StandardRsCaseItemSyntax>().item);
                            break;
                        case SyntaxKind::DefaultRsCaseItem:
                            countProd(*item->as<DefaultRsCaseItemSyntax>().item);
                            break;
                        default:
                            SLANG_UNREACHABLE;
                    }
                }
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    auto& comp = scope.getCompilation();
    for (auto [symbol, count] : prodMap) {
        auto var = comp.emplace<VariableSymbol>(symbol->name, syntax.getFirstToken().location(),
                                                VariableLifetime::Automatic);
        var->flags |= VariableFlags::Const | VariableFlags::CompilerGenerated;

        if (count == 1) {
            var->setType(symbol->getReturnType());
        }
        else {
            ConstantRange range{1, int32_t(count)};
            var->setType(
                FixedSizeUnpackedArrayType::fromDim(scope, symbol->getReturnType(), range, syntax));
        }

        results.push_back(var);
    }
}